

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O2

mnist_model *
mnist_model_init_from_file
          (mnist_model *__return_storage_ptr__,string *fname,string *backend,int nbatch_logical,
          int nbatch_physical)

{
  ggml_context **ppgVar1;
  bool bVar2;
  gguf_context *ctx_gguf;
  undefined8 uVar3;
  ggml_tensor *pgVar4;
  ggml_backend_buffer_t pgVar5;
  char *pcVar6;
  
  mnist_model::mnist_model(__return_storage_ptr__,backend,nbatch_logical,nbatch_physical);
  fprintf(_stderr,"%s: loading model weights from \'%s\'\n","mnist_model_init_from_file",
          (fname->_M_dataplus)._M_p);
  ppgVar1 = &__return_storage_ptr__->ctx_gguf;
  ctx_gguf = (gguf_context *)gguf_init_from_file((fname->_M_dataplus)._M_p,1,ppgVar1);
  if (ctx_gguf == (gguf_context *)0x0) {
    fprintf(_stderr,"%s: gguf_init_from_file() failed\n","mnist_model_init_from_file");
  }
  else {
    uVar3 = gguf_find_key(ctx_gguf,"general.architecture");
    gguf_get_val_str(ctx_gguf,uVar3);
    std::__cxx11::string::assign((char *)__return_storage_ptr__);
    fprintf(_stderr,"%s: model arch is %s\n","mnist_model_init_from_file",
            (__return_storage_ptr__->arch)._M_dataplus._M_p);
    bVar2 = std::operator==(&__return_storage_ptr__->arch,"mnist-fc");
    if (bVar2) {
      pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"fc1.weight");
      __return_storage_ptr__->fc1_weight = pgVar4;
      if (pgVar4->ne[0] != 0x310) {
        pcVar6 = "model.fc1_weight->ne[0] == MNIST_NINPUT";
        uVar3 = 0x98;
LAB_00105849:
        uVar3 = ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                           ,uVar3,"GGML_ASSERT(%s) failed",pcVar6);
        mnist_model::~mnist_model(__return_storage_ptr__);
        _Unwind_Resume(uVar3);
      }
      if (pgVar4->ne[1] != 500) {
        pcVar6 = "model.fc1_weight->ne[1] == MNIST_NHIDDEN";
        uVar3 = 0x99;
        goto LAB_00105849;
      }
      if (pgVar4->ne[2] != 1) {
        pcVar6 = "model.fc1_weight->ne[2] == 1";
        uVar3 = 0x9a;
        goto LAB_00105849;
      }
      if (pgVar4->ne[3] != 1) {
        pcVar6 = "model.fc1_weight->ne[3] == 1";
        uVar3 = 0x9b;
        goto LAB_00105849;
      }
      pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"fc1.bias");
      __return_storage_ptr__->fc1_bias = pgVar4;
      if (pgVar4->ne[0] != 500) {
        pcVar6 = "model.fc1_bias->ne[0] == MNIST_NHIDDEN";
        uVar3 = 0x9e;
        goto LAB_00105849;
      }
      if (pgVar4->ne[1] != 1) {
        pcVar6 = "model.fc1_bias->ne[1] == 1";
        uVar3 = 0x9f;
        goto LAB_00105849;
      }
      if (pgVar4->ne[2] != 1) {
        pcVar6 = "model.fc1_bias->ne[2] == 1";
        uVar3 = 0xa0;
        goto LAB_00105849;
      }
      if (pgVar4->ne[3] != 1) {
        pcVar6 = "model.fc1_bias->ne[3] == 1";
        uVar3 = 0xa1;
        goto LAB_00105849;
      }
      pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"fc2.weight");
      __return_storage_ptr__->fc2_weight = pgVar4;
      if (pgVar4->ne[0] != 500) {
        pcVar6 = "model.fc2_weight->ne[0] == MNIST_NHIDDEN";
        uVar3 = 0xa4;
        goto LAB_00105849;
      }
      if (pgVar4->ne[1] != 10) {
        pcVar6 = "model.fc2_weight->ne[1] == MNIST_NCLASSES";
        uVar3 = 0xa5;
        goto LAB_00105849;
      }
      if (pgVar4->ne[2] != 1) {
        pcVar6 = "model.fc2_weight->ne[2] == 1";
        uVar3 = 0xa6;
        goto LAB_00105849;
      }
      if (pgVar4->ne[3] != 1) {
        pcVar6 = "model.fc2_weight->ne[3] == 1";
        uVar3 = 0xa7;
        goto LAB_00105849;
      }
      pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"fc2.bias");
      __return_storage_ptr__->fc2_bias = pgVar4;
      if (pgVar4->ne[0] != 10) {
        pcVar6 = "model.fc2_bias->ne[0] == MNIST_NCLASSES";
        uVar3 = 0xaa;
        goto LAB_00105849;
      }
      if (pgVar4->ne[1] != 1) {
        pcVar6 = "model.fc2_bias->ne[1] == 1";
        uVar3 = 0xab;
        goto LAB_00105849;
      }
      if (pgVar4->ne[2] != 1) {
        pcVar6 = "model.fc2_bias->ne[2] == 1";
        uVar3 = 0xac;
        goto LAB_00105849;
      }
      if (pgVar4->ne[3] != 1) {
        pcVar6 = "model.fc2_bias->ne[3] == 1";
        uVar3 = 0xad;
        goto LAB_00105849;
      }
    }
    else {
      bVar2 = std::operator==(&__return_storage_ptr__->arch,"mnist-cnn");
      if (bVar2) {
        pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"conv1.kernel");
        __return_storage_ptr__->conv1_kernel = pgVar4;
        if (pgVar4->type != GGML_TYPE_F32) {
          pcVar6 = "model.conv1_kernel->type == GGML_TYPE_F32";
          uVar3 = 0xb0;
          goto LAB_00105849;
        }
        if (pgVar4->ne[0] != 3) {
          pcVar6 = "model.conv1_kernel->ne[0] == 3";
          uVar3 = 0xb1;
          goto LAB_00105849;
        }
        if (pgVar4->ne[1] != 3) {
          pcVar6 = "model.conv1_kernel->ne[1] == 3";
          uVar3 = 0xb2;
          goto LAB_00105849;
        }
        if (pgVar4->ne[2] != 1) {
          pcVar6 = "model.conv1_kernel->ne[2] == 1";
          uVar3 = 0xb3;
          goto LAB_00105849;
        }
        if (pgVar4->ne[3] != 8) {
          pcVar6 = "model.conv1_kernel->ne[3] == MNIST_CNN_NCB";
          uVar3 = 0xb4;
          goto LAB_00105849;
        }
        pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"conv1.bias");
        __return_storage_ptr__->conv1_bias = pgVar4;
        if (pgVar4->type != GGML_TYPE_F32) {
          pcVar6 = "model.conv1_bias->type == GGML_TYPE_F32";
          uVar3 = 0xb7;
          goto LAB_00105849;
        }
        if (pgVar4->ne[0] != 1) {
          pcVar6 = "model.conv1_bias->ne[0] == 1";
          uVar3 = 0xb8;
          goto LAB_00105849;
        }
        if (pgVar4->ne[1] != 1) {
          pcVar6 = "model.conv1_bias->ne[1] == 1";
          uVar3 = 0xb9;
          goto LAB_00105849;
        }
        if (pgVar4->ne[2] != 8) {
          pcVar6 = "model.conv1_bias->ne[2] == MNIST_CNN_NCB";
          uVar3 = 0xba;
          goto LAB_00105849;
        }
        if (pgVar4->ne[3] != 1) {
          pcVar6 = "model.conv1_bias->ne[3] == 1";
          uVar3 = 0xbb;
          goto LAB_00105849;
        }
        pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"conv2.kernel");
        __return_storage_ptr__->conv2_kernel = pgVar4;
        if (pgVar4->type != GGML_TYPE_F32) {
          pcVar6 = "model.conv2_kernel->type == GGML_TYPE_F32";
          uVar3 = 0xbe;
          goto LAB_00105849;
        }
        if (pgVar4->ne[0] != 3) {
          pcVar6 = "model.conv2_kernel->ne[0] == 3";
          uVar3 = 0xbf;
          goto LAB_00105849;
        }
        if (pgVar4->ne[1] != 3) {
          pcVar6 = "model.conv2_kernel->ne[1] == 3";
          uVar3 = 0xc0;
          goto LAB_00105849;
        }
        if (pgVar4->ne[2] != 8) {
          pcVar6 = "model.conv2_kernel->ne[2] == MNIST_CNN_NCB";
          uVar3 = 0xc1;
          goto LAB_00105849;
        }
        if (pgVar4->ne[3] != 0x10) {
          pcVar6 = "model.conv2_kernel->ne[3] == MNIST_CNN_NCB*2";
          uVar3 = 0xc2;
          goto LAB_00105849;
        }
        pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"conv2.bias");
        __return_storage_ptr__->conv2_bias = pgVar4;
        if (pgVar4->type != GGML_TYPE_F32) {
          pcVar6 = "model.conv2_bias->type == GGML_TYPE_F32";
          uVar3 = 0xc5;
          goto LAB_00105849;
        }
        if (pgVar4->ne[0] != 1) {
          pcVar6 = "model.conv2_bias->ne[0] == 1";
          uVar3 = 0xc6;
          goto LAB_00105849;
        }
        if (pgVar4->ne[1] != 1) {
          pcVar6 = "model.conv2_bias->ne[1] == 1";
          uVar3 = 199;
          goto LAB_00105849;
        }
        if (pgVar4->ne[2] != 0x10) {
          pcVar6 = "model.conv2_bias->ne[2] == MNIST_CNN_NCB*2";
          uVar3 = 200;
          goto LAB_00105849;
        }
        if (pgVar4->ne[3] != 1) {
          pcVar6 = "model.conv2_bias->ne[3] == 1";
          uVar3 = 0xc9;
          goto LAB_00105849;
        }
        pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"dense.weight");
        __return_storage_ptr__->dense_weight = pgVar4;
        if (pgVar4->type != GGML_TYPE_F32) {
          pcVar6 = "model.dense_weight->type == GGML_TYPE_F32";
          uVar3 = 0xcc;
          goto LAB_00105849;
        }
        if (pgVar4->ne[0] != 0x310) {
          pcVar6 = "model.dense_weight->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2)";
          uVar3 = 0xcd;
          goto LAB_00105849;
        }
        if (pgVar4->ne[1] != 10) {
          pcVar6 = "model.dense_weight->ne[1] == MNIST_NCLASSES";
          uVar3 = 0xce;
          goto LAB_00105849;
        }
        if (pgVar4->ne[2] != 1) {
          pcVar6 = "model.dense_weight->ne[2] == 1";
          uVar3 = 0xcf;
          goto LAB_00105849;
        }
        if (pgVar4->ne[3] != 1) {
          pcVar6 = "model.dense_weight->ne[3] == 1";
          uVar3 = 0xd0;
          goto LAB_00105849;
        }
        pgVar4 = (ggml_tensor *)ggml_get_tensor(*ppgVar1,"dense.bias");
        __return_storage_ptr__->dense_bias = pgVar4;
        if (pgVar4->type != GGML_TYPE_F32) {
          pcVar6 = "model.dense_bias->type == GGML_TYPE_F32";
          uVar3 = 0xd3;
          goto LAB_00105849;
        }
        if (pgVar4->ne[0] != 10) {
          pcVar6 = "model.dense_bias->ne[0] == MNIST_NCLASSES";
          uVar3 = 0xd4;
          goto LAB_00105849;
        }
        if (pgVar4->ne[1] != 1) {
          pcVar6 = "model.dense_bias->ne[1] == 1";
          uVar3 = 0xd5;
          goto LAB_00105849;
        }
        if (pgVar4->ne[2] != 1) {
          pcVar6 = "model.dense_bias->ne[2] == 1";
          uVar3 = 0xd6;
          goto LAB_00105849;
        }
        if (pgVar4->ne[3] != 1) {
          pcVar6 = "model.dense_bias->ne[3] == 1";
          uVar3 = 0xd7;
          goto LAB_00105849;
        }
      }
      else {
        fprintf(_stderr,"%s: unknown model arch: %s\n","mnist_model_init_from_file",
                (__return_storage_ptr__->arch)._M_dataplus._M_p);
      }
    }
    pgVar5 = (ggml_backend_buffer_t)
             ggml_backend_alloc_ctx_tensors
                       (__return_storage_ptr__->ctx_gguf,
                        *(__return_storage_ptr__->backends).
                         super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>._M_impl
                         .super__Vector_impl_data._M_start);
    __return_storage_ptr__->buf_gguf = pgVar5;
    bVar2 = load_from_gguf((fname->_M_dataplus)._M_p,__return_storage_ptr__->ctx_gguf,ctx_gguf);
    if (bVar2) {
      pgVar4 = (ggml_tensor *)ggml_new_tensor_2d(__return_storage_ptr__->ctx_static,0,0x310,500);
      __return_storage_ptr__->images = pgVar4;
      ggml_set_name(pgVar4,"images");
      ggml_set_input(__return_storage_ptr__->images);
      pgVar5 = (ggml_backend_buffer_t)
               ggml_backend_alloc_ctx_tensors
                         (__return_storage_ptr__->ctx_static,
                          *(__return_storage_ptr__->backends).
                           super__Vector_base<ggml_backend_*,_std::allocator<ggml_backend_*>_>.
                           _M_impl.super__Vector_impl_data._M_start);
      __return_storage_ptr__->buf_static = pgVar5;
      fprintf(_stderr,"%s: successfully loaded weights from %s\n","mnist_model_init_from_file",
              (fname->_M_dataplus)._M_p);
      return __return_storage_ptr__;
    }
    fprintf(_stderr,"%s: loading weights from %s failed\n","mnist_model_init_from_file",
            (fname->_M_dataplus)._M_p);
  }
  exit(1);
}

Assistant:

mnist_model mnist_model_init_from_file(const std::string & fname, const std::string & backend, const int nbatch_logical, const int nbatch_physical) {
    mnist_model model(backend, nbatch_logical, nbatch_physical);
    fprintf(stderr, "%s: loading model weights from '%s'\n", __func__, fname.c_str());

    struct gguf_context * ctx;
    {
        struct gguf_init_params params = {
            /*.no_alloc   =*/ true,
            /*.ctx        =*/ &model.ctx_gguf,
        };
        ctx = gguf_init_from_file(fname.c_str(), params);
        if (!ctx) {
            fprintf(stderr, "%s: gguf_init_from_file() failed\n", __func__);
            exit(1);
        }
    }
    model.arch = gguf_get_val_str(ctx, gguf_find_key(ctx, "general.architecture"));
    fprintf(stderr, "%s: model arch is %s\n", __func__, model.arch.c_str());

    if (model.arch == "mnist-fc") {
        model.fc1_weight = ggml_get_tensor(model.ctx_gguf, "fc1.weight");
        GGML_ASSERT(model.fc1_weight->ne[0] == MNIST_NINPUT);
        GGML_ASSERT(model.fc1_weight->ne[1] == MNIST_NHIDDEN);
        GGML_ASSERT(model.fc1_weight->ne[2] == 1);
        GGML_ASSERT(model.fc1_weight->ne[3] == 1);

        model.fc1_bias = ggml_get_tensor(model.ctx_gguf, "fc1.bias");
        GGML_ASSERT(model.fc1_bias->ne[0] == MNIST_NHIDDEN);
        GGML_ASSERT(model.fc1_bias->ne[1] == 1);
        GGML_ASSERT(model.fc1_bias->ne[2] == 1);
        GGML_ASSERT(model.fc1_bias->ne[3] == 1);

        model.fc2_weight = ggml_get_tensor(model.ctx_gguf, "fc2.weight");
        GGML_ASSERT(model.fc2_weight->ne[0] == MNIST_NHIDDEN);
        GGML_ASSERT(model.fc2_weight->ne[1] == MNIST_NCLASSES);
        GGML_ASSERT(model.fc2_weight->ne[2] == 1);
        GGML_ASSERT(model.fc2_weight->ne[3] == 1);

        model.fc2_bias = ggml_get_tensor(model.ctx_gguf, "fc2.bias");
        GGML_ASSERT(model.fc2_bias->ne[0] == MNIST_NCLASSES);
        GGML_ASSERT(model.fc2_bias->ne[1] == 1);
        GGML_ASSERT(model.fc2_bias->ne[2] == 1);
        GGML_ASSERT(model.fc2_bias->ne[3] == 1);
    } else if (model.arch == "mnist-cnn") {
        model.conv1_kernel = ggml_get_tensor(model.ctx_gguf, "conv1.kernel");
        GGML_ASSERT(model.conv1_kernel->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv1_kernel->ne[0] == 3);
        GGML_ASSERT(model.conv1_kernel->ne[1] == 3);
        GGML_ASSERT(model.conv1_kernel->ne[2] == 1);
        GGML_ASSERT(model.conv1_kernel->ne[3] == MNIST_CNN_NCB);

        model.conv1_bias = ggml_get_tensor(model.ctx_gguf, "conv1.bias");
        GGML_ASSERT(model.conv1_bias->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv1_bias->ne[0] == 1);
        GGML_ASSERT(model.conv1_bias->ne[1] == 1);
        GGML_ASSERT(model.conv1_bias->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(model.conv1_bias->ne[3] == 1);

        model.conv2_kernel = ggml_get_tensor(model.ctx_gguf, "conv2.kernel");
        GGML_ASSERT(model.conv2_kernel->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv2_kernel->ne[0] == 3);
        GGML_ASSERT(model.conv2_kernel->ne[1] == 3);
        GGML_ASSERT(model.conv2_kernel->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(model.conv2_kernel->ne[3] == MNIST_CNN_NCB*2);

        model.conv2_bias = ggml_get_tensor(model.ctx_gguf, "conv2.bias");
        GGML_ASSERT(model.conv2_bias->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv2_bias->ne[0] == 1);
        GGML_ASSERT(model.conv2_bias->ne[1] == 1);
        GGML_ASSERT(model.conv2_bias->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(model.conv2_bias->ne[3] == 1);

        model.dense_weight = ggml_get_tensor(model.ctx_gguf, "dense.weight");
        GGML_ASSERT(model.dense_weight->type == GGML_TYPE_F32);
        GGML_ASSERT(model.dense_weight->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2));
        GGML_ASSERT(model.dense_weight->ne[1] == MNIST_NCLASSES);
        GGML_ASSERT(model.dense_weight->ne[2] == 1);
        GGML_ASSERT(model.dense_weight->ne[3] == 1);

        model.dense_bias = ggml_get_tensor(model.ctx_gguf, "dense.bias");
        GGML_ASSERT(model.dense_bias->type == GGML_TYPE_F32);
        GGML_ASSERT(model.dense_bias->ne[0] == MNIST_NCLASSES);
        GGML_ASSERT(model.dense_bias->ne[1] == 1);
        GGML_ASSERT(model.dense_bias->ne[2] == 1);
        GGML_ASSERT(model.dense_bias->ne[3] == 1);
    } else {
        fprintf(stderr, "%s: unknown model arch: %s\n", __func__, model.arch.c_str());
    }

    model.buf_gguf = ggml_backend_alloc_ctx_tensors(model.ctx_gguf, model.backends[0]);

    if(!load_from_gguf(fname.c_str(), model.ctx_gguf, ctx)) {
        fprintf(stderr, "%s: loading weights from %s failed\n", __func__, fname.c_str());
        exit(1);
    }

    // The space in ctx_gguf exactly fits the model weights,
    // the images (which also need to be statically allocated) need to be put in a different context.

    model.images = ggml_new_tensor_2d(model.ctx_static, GGML_TYPE_F32, MNIST_NINPUT, MNIST_NBATCH_PHYSICAL);
    ggml_set_name(model.images, "images");
    ggml_set_input(model.images);

    model.buf_static = ggml_backend_alloc_ctx_tensors(model.ctx_static, model.backends[0]);

    fprintf(stderr, "%s: successfully loaded weights from %s\n", __func__, fname.c_str());
    return model;
}